

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucm.cpp
# Opt level: O2

UBool ucm_separateMappings(UCMFile *ucm,UBool isSISO)

{
  UCMTable *table;
  bool bVar1;
  bool bVar2;
  UBool UVar3;
  int32_t iVar4;
  UChar32 *in_RDX;
  UChar32 *extraout_RDX;
  anon_union_4_2_095b93d3_for_b *paVar5;
  UChar32 *extraout_RDX_00;
  UChar32 *extraout_RDX_01;
  UCMapping *codePoints;
  UCMapping *m;
  UCMapping *pUVar6;
  
  table = ucm->base;
  m = table->mappings;
  pUVar6 = m + table->mappingsLength;
  bVar1 = true;
  bVar2 = false;
  do {
    if (pUVar6 <= m) {
      if (bVar1) {
        if (bVar2) {
          ucm_moveMappings(ucm->base,ucm->ext);
          UVar3 = ucm_checkBaseExt(&ucm->states,ucm->base,ucm->ext,ucm->ext,'\0');
          return UVar3;
        }
        ucm_sortTable(ucm->base);
        UVar3 = '\x01';
      }
      else {
        UVar3 = '\0';
      }
      return UVar3;
    }
    if (((isSISO == '\0') || (m->bLen != '\x01')) || (((m->b).bytes[0] & 0xfe) != 0xe)) {
      if (m->bLen < '\x05') {
        paVar5 = &m->b;
      }
      else {
        paVar5 = (anon_union_4_2_095b93d3_for_b *)(table->bytes + (m->b).idx);
      }
      iVar4 = ucm_mappingType(&ucm->states,m,in_RDX,paVar5->bytes);
      if (iVar4 < 0) {
        codePoints = m;
        if (m->uLen != '\x01') {
          codePoints = (UCMapping *)(table->codePoints + m->u);
        }
        if (m->bLen < '\x05') {
          paVar5 = &m->b;
        }
        else {
          paVar5 = (anon_union_4_2_095b93d3_for_b *)(table->bytes + (m->b).idx);
        }
        printMapping(m,&codePoints->u,paVar5->bytes,(FILE *)_stderr);
        bVar1 = false;
        in_RDX = extraout_RDX_00;
      }
      else {
        in_RDX = extraout_RDX;
        if (iVar4 != 0) {
          m->moveFlag = m->moveFlag | 1;
          goto LAB_001ea1ff;
        }
      }
    }
    else {
      fwrite("warning: removing illegal mapping from an SI/SO-stateful table\n",0x3f,1,_stderr);
      ucm_printMapping(table,m,(FILE *)_stderr);
      m->moveFlag = m->moveFlag | 2;
      in_RDX = extraout_RDX_01;
LAB_001ea1ff:
      bVar2 = true;
    }
    m = m + 1;
  } while( true );
}

Assistant:

U_CAPI UBool U_EXPORT2
ucm_separateMappings(UCMFile *ucm, UBool isSISO) {
    UCMTable *table;
    UCMapping *m, *mLimit;
    int32_t type;
    UBool needsMove, isOK;

    table=ucm->base;
    m=table->mappings;
    mLimit=m+table->mappingsLength;

    needsMove=FALSE;
    isOK=TRUE;

    for(; m<mLimit; ++m) {
        if(isSISO && m->bLen==1 && (m->b.bytes[0]==0xe || m->b.bytes[0]==0xf)) {
            fprintf(stderr, "warning: removing illegal mapping from an SI/SO-stateful table\n");
            ucm_printMapping(table, m, stderr);
            m->moveFlag|=UCM_REMOVE_MAPPING;
            needsMove=TRUE;
            continue;
        }

        type=ucm_mappingType(
                &ucm->states, m,
                UCM_GET_CODE_POINTS(table, m), UCM_GET_BYTES(table, m));
        if(type<0) {
            /* illegal byte sequence */
            printMapping(m, UCM_GET_CODE_POINTS(table, m), UCM_GET_BYTES(table, m), stderr);
            isOK=FALSE;
        } else if(type>0) {
            m->moveFlag|=UCM_MOVE_TO_EXT;
            needsMove=TRUE;
        }
    }

    if(!isOK) {
        return FALSE;
    }
    if(needsMove) {
        ucm_moveMappings(ucm->base, ucm->ext);
        return ucm_checkBaseExt(&ucm->states, ucm->base, ucm->ext, ucm->ext, FALSE);
    } else {
        ucm_sortTable(ucm->base);
        return TRUE;
    }
}